

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.h
# Opt level: O3

poly * __thiscall poly::operator+=(poly *this,poly *o)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type __n;
  
  puVar2 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((*(int *)&(o->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
        *(int *)&(o->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start ^ (int)puVar3 - (int)puVar2) & 0x1ffffffcU) == 0)
  {
    if (puVar3 != puVar2) {
      __n = 0;
      do {
        pvVar4 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&o->x,__n);
        uVar1 = *pvVar4;
        pvVar5 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->x,__n);
        *pvVar5 = *pvVar5 ^ uVar1;
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->x).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->x).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
    }
    this->_degree = -1;
    return this;
  }
  __assert_fail("bits() == o.bits()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/uranix[P]factormod/poly.h"
                ,0x5f,"poly &poly::operator+=(const poly &)");
}

Assistant:

poly &operator+=(const poly &o) {
        assert(bits() == o.bits());
        for (size_t i = 0; i < x.size(); i++)
            x[i] ^= o.x[i];
        _degree = -1;
        return *this;
    }